

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

int cgltf_parse_json_texture_view
              (jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_texture_view *out_texture_view)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cgltf_float cVar4;
  int local_40;
  int k;
  int extensions_size;
  int j;
  int size;
  cgltf_texture_view *out_texture_view_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  
  if (tokens[i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    cgltf_fill_float_array((out_texture_view->transform).scale,2,1.0);
    iVar1 = tokens[i].size;
    json_chunk_local._4_4_ = i + 1;
    for (k = 0; k < iVar1; k = k + 1) {
      if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
         (tokens[json_chunk_local._4_4_].size == 0)) {
        return -1;
      }
      iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"index");
      if (iVar2 == 0) {
        iVar2 = cgltf_json_to_int(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar2 + 1);
        json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
      }
      else {
        iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"texCoord");
        if (iVar2 == 0) {
          iVar2 = cgltf_json_to_int(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
          out_texture_view->texcoord = iVar2;
          json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
        }
        else {
          iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"scale");
          if (iVar2 == 0) {
            cVar4 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
            out_texture_view->scale = cVar4;
            json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
          }
          else {
            iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"strength");
            if (iVar2 == 0) {
              cVar4 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
              out_texture_view->scale = cVar4;
              json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
            }
            else {
              iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"extras");
              if (iVar2 == 0) {
                json_chunk_local._4_4_ =
                     cgltf_parse_json_extras
                               (tokens,json_chunk_local._4_4_ + 1,json_chunk,
                                &out_texture_view->extras);
              }
              else {
                iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"extensions");
                if (iVar2 == 0) {
                  if (tokens[json_chunk_local._4_4_ + 1].type != JSMN_OBJECT) {
                    return -1;
                  }
                  iVar2 = tokens[json_chunk_local._4_4_ + 1].size;
                  json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
                  for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
                    if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
                       (tokens[json_chunk_local._4_4_].size == 0)) {
                      return -1;
                    }
                    iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,
                                              "KHR_texture_transform");
                    if (iVar3 == 0) {
                      out_texture_view->has_transform = 1;
                      json_chunk_local._4_4_ =
                           cgltf_parse_json_texture_transform
                                     (tokens,json_chunk_local._4_4_ + 1,json_chunk,
                                      &out_texture_view->transform);
                    }
                    else {
                      json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
                    }
                    if (json_chunk_local._4_4_ < 0) {
                      return json_chunk_local._4_4_;
                    }
                  }
                }
                else {
                  json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
                }
              }
            }
          }
        }
      }
      if (json_chunk_local._4_4_ < 0) {
        return json_chunk_local._4_4_;
      }
    }
    tokens_local._4_4_ = json_chunk_local._4_4_;
  }
  else {
    tokens_local._4_4_ = -1;
  }
  return tokens_local._4_4_;
}

Assistant:

static int cgltf_parse_json_texture_view(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
    CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

    out_texture_view->scale = 1.0f;
    cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

    int size = tokens[i].size;
    ++i;

    for (int j = 0; j < size; ++j)
    {
        CGLTF_CHECK_KEY(tokens[i]);

        if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
        {
            ++i;
            out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
        {
            ++i;
            out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
        {
            i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
        {
            ++i;

            CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

            int extensions_size = tokens[i].size;
            ++i;

            for (int k = 0; k < extensions_size; ++k)
            {
                CGLTF_CHECK_KEY(tokens[i]);

                if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
                {
                    out_texture_view->has_transform = 1;
                    i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
                }
                else
                {
                    i = cgltf_skip_json(tokens, i+1);
                }

                if (i < 0)
                {
                    return i;
                }
            }
        }
        else
        {
            i = cgltf_skip_json(tokens, i + 1);
        }

        if (i < 0)
        {
            return i;
        }
    }

    return i;
}